

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotating_file_sink
          (rotating_file_sink<std::mutex> *this,filename_t *base_filename,size_t max_size,
          size_t max_files)

{
  size_t sVar1;
  filename_t local_48;
  size_t local_28;
  size_t max_files_local;
  size_t max_size_local;
  filename_t *base_filename_local;
  rotating_file_sink<std::mutex> *this_local;
  
  local_28 = max_files;
  max_files_local = max_size;
  max_size_local = (size_t)base_filename;
  base_filename_local = (filename_t *)this;
  base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__rotating_file_sink_003a48a0;
  std::__cxx11::string::string((string *)&this->base_filename_,(string *)base_filename);
  this->max_size_ = max_files_local;
  this->max_files_ = local_28;
  details::file_helper::file_helper(&this->file_helper_);
  calc_filename(&local_48,&this->base_filename_,0);
  details::file_helper::open(&this->file_helper_,(char *)&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  sVar1 = details::file_helper::size(&this->file_helper_);
  this->current_size_ = sVar1;
  return;
}

Assistant:

rotating_file_sink(filename_t base_filename, std::size_t max_size, std::size_t max_files)
        : base_filename_(std::move(base_filename))
        , max_size_(max_size)
        , max_files_(max_files)
    {
        file_helper_.open(calc_filename(base_filename_, 0));
        current_size_ = file_helper_.size(); // expensive. called only once
    }